

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::
Stack<std::unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>_>
::expand(Stack<std::unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>_>
         *this)

{
  unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
  *puVar1;
  unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
  *puVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  size_t sVar5;
  
  sVar5 = 8;
  if (this->_capacity != 0) {
    sVar5 = this->_capacity * 2;
  }
  uVar3 = sVar5 * 8;
  if (uVar3 == 0) {
    puVar2 = (unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
              *)FixedSizeAllocator<8UL>::alloc
                          ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar3 < 0x11) {
    puVar2 = (unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
              *)FixedSizeAllocator<16UL>::alloc
                          ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar3 < 0x19) {
    puVar2 = (unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
              *)FixedSizeAllocator<24UL>::alloc
                          ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar3 < 0x21) {
    puVar2 = (unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
              *)FixedSizeAllocator<32UL>::alloc
                          ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar3 < 0x31) {
    puVar2 = (unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
              *)FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar3 < 0x41) {
    puVar2 = (unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
              *)FixedSizeAllocator<64UL>::alloc
                          ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    puVar2 = (unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
              *)::operator_new(uVar3,0x10);
  }
  if (this->_capacity == 0) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    do {
      puVar1 = this->_stack;
      puVar2[uVar4]._M_t.
      super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>._M_head_impl
           = puVar1[uVar4]._M_t.
             super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
             ._M_t.
             super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
             .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
             _M_head_impl;
      puVar1[uVar4]._M_t.
      super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>._M_head_impl
           = (RemovingLiteralMatcher *)0x0;
      std::
      unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      ::~unique_ptr(this->_stack + uVar4);
      uVar4 = uVar4 + 1;
      uVar3 = this->_capacity;
    } while (uVar4 < uVar3);
    puVar1 = this->_stack;
    if (puVar1 != (unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                   *)0x0) {
      uVar4 = uVar3 * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        (puVar1->_M_t).
        super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        ._M_t.
        super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
        _M_head_impl = (RemovingLiteralMatcher *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar1;
      }
      else if (uVar4 < 0x11) {
        (puVar1->_M_t).
        super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        ._M_t.
        super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
        _M_head_impl = (RemovingLiteralMatcher *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar1;
      }
      else if (uVar4 < 0x19) {
        (puVar1->_M_t).
        super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        ._M_t.
        super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
        _M_head_impl = (RemovingLiteralMatcher *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar1;
      }
      else if (uVar4 < 0x21) {
        (puVar1->_M_t).
        super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        ._M_t.
        super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
        _M_head_impl = (RemovingLiteralMatcher *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar1;
      }
      else if (uVar4 < 0x31) {
        (puVar1->_M_t).
        super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        ._M_t.
        super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
        _M_head_impl = (RemovingLiteralMatcher *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar1;
      }
      else if (uVar4 < 0x41) {
        (puVar1->_M_t).
        super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        ._M_t.
        super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
        _M_head_impl = (RemovingLiteralMatcher *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar1;
      }
      else {
        operator_delete(puVar1,0x10);
        uVar3 = this->_capacity;
      }
    }
  }
  this->_stack = puVar2;
  this->_cursor = puVar2 + uVar3;
  this->_end = puVar2 + sVar5;
  this->_capacity = sVar5;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }